

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  REF_MPI ref_mpi;
  uint uVar1;
  uint uVar2;
  void *__ptr;
  void *__ptr_00;
  ulong uVar3;
  long lVar4;
  clock_t cVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS RVar11;
  long lVar12;
  void *__ptr_01;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  void *pvVar18;
  double dVar19;
  int local_f0;
  long local_e8;
  long local_c8;
  long local_c0;
  uint local_a0;
  REF_INT local;
  long local_98;
  ulong local_90;
  long local_88;
  long local_80;
  long local_78;
  void *local_70;
  long local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  REF_DBL *local_48;
  FILE *local_40;
  ulong local_38;
  
  ref_mpi = ref_node->ref_mpi;
  lVar4 = ref_node->old_n_global;
  uVar16 = (int)(lVar4 / (long)ref_mpi->n) + 1;
  uVar1 = uVar16;
  if ((0 < ref_mpi->reduce_byte_limit) &&
     (uVar1 = ref_mpi->reduce_byte_limit / (ldim * 8 + 8), (int)uVar16 < (int)uVar1)) {
    uVar1 = uVar16;
  }
  iVar14 = ldim + 1;
  uVar16 = uVar1 * iVar14;
  local_48 = scalar;
  local_40 = (FILE *)file;
  if ((int)uVar16 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x67d,
           "ref_gather_node_scalar_bin","malloc local_xyzm of REF_DBL negative");
LAB_0017be68:
    RVar11 = 1;
  }
  else {
    local_38 = (ulong)uVar16;
    sVar6 = local_38 * 8;
    __ptr = malloc(sVar6);
    if (__ptr == (void *)0x0) {
      pcVar13 = "malloc local_xyzm of REF_DBL NULL";
      uVar9 = 0x67d;
    }
    else {
      __ptr_00 = malloc(sVar6);
      if (__ptr_00 != (void *)0x0) {
        local_60 = (long)(int)uVar1;
        lVar10 = (long)ldim;
        uVar15 = 0;
        if (0 < ldim) {
          uVar15 = (ulong)(uint)ldim;
        }
        local_88 = (long)iVar14;
        local_58 = (void *)((long)__ptr + lVar10 * 8);
        local_70 = (void *)((long)__ptr_00 + lVar10 * 8);
        local_80 = local_88 * 8;
        local_78 = uVar15 + 1;
        local_e8 = 0;
        local_98 = 0;
        local_c0 = 0;
        local_c8 = 0;
        uVar2 = 0;
        lVar12 = 0;
        local_90 = (ulong)uVar1;
        local_50 = (ulong)(uint)ldim;
        do {
          uVar7 = lVar4 - lVar12;
          iVar17 = (int)local_90;
          if (uVar7 == 0 || lVar4 < lVar12) {
            free(__ptr_00);
            free(__ptr);
            if (1 < ref_mpi->timing) {
              printf(" local %f mpi %f disk %f rank %d\n",(double)local_98 / 1000000.0,
                     (double)local_c0 / 1000000.0,(double)local_c8 / 1000000.0,
                     (ulong)(uint)ref_mpi->id);
            }
            if (ref_mpi->reduce_byte_limit < 1) {
              iVar14 = 0x7fffffff;
            }
            else {
              iVar14 = ref_mpi->reduce_byte_limit / (iVar14 * 8);
            }
            if (iVar17 != iVar14) {
              return 0;
            }
            if (ref_mpi->id != 0) {
              return 0;
            }
            printf("mpi reduce limited to %d chunks of %d bytes\n",(ulong)uVar2,(ulong)(uVar16 * 8))
            ;
            return 0;
          }
          if (local_60 < (long)uVar7) {
            uVar7 = local_90;
          }
          if (1 < ref_mpi->timing) {
            local_e8 = clock();
          }
          uVar2 = uVar2 + 1;
          local_f0 = (int)uVar7;
          local_68 = local_f0 + lVar12;
          for (uVar3 = 0; local_38 != uVar3; uVar3 = uVar3 + 1) {
            *(undefined8 *)((long)__ptr + uVar3 * 8) = 0;
          }
          uVar3 = 0;
          if (0 < local_f0) {
            uVar3 = uVar7 & 0xffffffff;
          }
          pvVar18 = __ptr;
          for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
            uVar1 = ref_node_local(ref_node,lVar12 + uVar7,&local);
            if ((uVar1 != 0) && (uVar1 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x68f,"ref_gather_node_scalar_bin",(ulong)uVar1,"node local failed");
              local_a0 = uVar1;
            }
            if (uVar1 == 5) {
LAB_0017bc62:
              for (lVar4 = 0; lVar4 <= lVar10; lVar4 = lVar4 + 1) {
                *(undefined8 *)((long)pvVar18 + lVar4 * 8) = 0;
              }
            }
            else {
              if (uVar1 != 0) {
                return local_a0;
              }
              if (ref_mpi->id != ref_node->part[local]) goto LAB_0017bc62;
              for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
                *(REF_DBL *)((long)pvVar18 + uVar8 * 8) =
                     local_48[(long)(local * (int)local_50) + uVar8];
              }
              *(undefined8 *)((long)local_58 + uVar7 * local_88 * 8) = 0x3ff0000000000000;
            }
            pvVar18 = (void *)((long)pvVar18 + local_80);
          }
          if (1 < ref_mpi->timing) {
            cVar5 = clock();
            local_98 = local_98 + (cVar5 - local_e8);
            if (1 < ref_mpi->timing) {
              local_e8 = clock();
            }
          }
          uVar1 = ref_mpi_sum(ref_mpi,__ptr,__ptr_00,local_f0 * iVar14,3);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x69e,"ref_gather_node_scalar_bin",(ulong)uVar1,"sum");
            return uVar1;
          }
          if (1 < ref_mpi->timing) {
            cVar5 = clock();
            local_c0 = local_c0 + (cVar5 - local_e8);
            if (1 < ref_mpi->timing) {
              local_e8 = clock();
            }
          }
          if (ref_mpi->id == 0) {
            pvVar18 = __ptr_00;
            for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
              dVar19 = *(double *)((long)local_70 + uVar7 * local_88 * 8) + -1.0;
              if (dVar19 <= -dVar19) {
                dVar19 = -dVar19;
              }
              lVar4 = local_78;
              __ptr_01 = pvVar18;
              if (0.1 < dVar19) {
                printf("error gather node %ld %f\n",uVar7 + lVar12);
                lVar4 = local_78;
              }
              while (lVar4 + -1 != 0) {
                sVar6 = fwrite(__ptr_01,8,1,local_40);
                lVar4 = lVar4 + -1;
                __ptr_01 = (void *)((long)__ptr_01 + 8);
                if (sVar6 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x6ab,"ref_gather_node_scalar_bin","s",1,sVar6);
                  goto LAB_0017be68;
                }
              }
              pvVar18 = (void *)((long)pvVar18 + local_80);
            }
          }
          if (1 < ref_mpi->timing) {
            cVar5 = clock();
            local_c8 = (local_c8 - local_e8) + cVar5;
          }
          lVar4 = ref_node->old_n_global;
          lVar12 = local_68;
        } while( true );
      }
      pcVar13 = "malloc xyzm of REF_DBL NULL";
      uVar9 = 0x67e;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
           "ref_gather_node_scalar_bin",pcVar13);
    RVar11 = 2;
  }
  return RVar11;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,
                                                     REF_INT ldim,
                                                     REF_DBL *scalar,
                                                     FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk, nchunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;
  clock_t tic = 0;
  clock_t local_toc = 0;
  clock_t mpi_toc = 0;
  clock_t disk_toc = 0;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (ldim + 1) * chunk, REF_DBL);

  nchunk = 0;
  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    nchunk++;
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;
    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    for (i = 0; i < (ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < ldim; im++)
          local_xyzm[im + (ldim + 1) * i] = scalar[im + ldim * local];
        local_xyzm[ldim + (ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (ldim + 1); im++)
          local_xyzm[im + (ldim + 1) * i] = 0.0;
      }
    }
    if (1 < ref_mpi_timing(ref_mpi)) local_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (ldim + 1) * n, REF_DBL_TYPE),
        "sum");
    if (1 < ref_mpi_timing(ref_mpi)) mpi_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[ldim + (ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[ldim + (ldim + 1) * i]);
        }
        for (im = 0; im < ldim; im++) {
          REIS(1,
               fwrite(&(xyzm[im + (ldim + 1) * i]), sizeof(REF_DBL), 1, file),
               "s");
        }
      }
    if (1 < ref_mpi_timing(ref_mpi)) disk_toc += (clock() - tic);
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  if (1 < ref_mpi_timing(ref_mpi)) {
    printf(" local %f mpi %f disk %f rank %d\n",
           ((REF_DBL)local_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)mpi_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)disk_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ref_mpi_rank(ref_mpi));
  }

  if (chunk == ref_mpi_reduce_chunk_limit(
                   ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL))) {
    if (ref_mpi_once(ref_mpi)) {
      printf("mpi reduce limited to %d chunks of %d bytes\n", nchunk,
             chunk * (ldim + 1) * (REF_INT)sizeof(REF_DBL));
    }
  }

  return REF_SUCCESS;
}